

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

void stats_print_helper(emitter_t *emitter,_Bool merged,_Bool destroyed,_Bool unmerged,_Bool bins,
                       _Bool large,_Bool mutex,_Bool extents)

{
  byte *oldp;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  undefined1 auVar8 [8];
  uint64_t uVar9;
  _Bool _Var10;
  _Bool _Var11;
  uint uVar12;
  emitter_t *peVar13;
  emitter_t *peVar14;
  int iVar15;
  int iVar16;
  emitter_output_t eVar17;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  emitter_row_t eVar18;
  ulong uVar19;
  size_t *psVar20;
  size_t *psVar21;
  undefined7 in_register_00000031;
  undefined1 *puVar22;
  char *format;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  uint uVar23;
  char *pcVar24;
  bool bVar25;
  undefined8 uStack_370;
  size_t local_368;
  char arena_ind_str [20];
  undefined1 local_2e8 [8];
  size_t sz;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_2d8 [4];
  undefined4 local_2b8;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_2b0;
  undefined4 local_290;
  ulong local_288 [4];
  undefined4 local_268;
  ulong local_260;
  undefined4 local_240;
  ulong local_238 [4];
  undefined4 local_218;
  ulong local_210;
  undefined4 local_1f0;
  ulong local_1e8 [4];
  undefined4 local_1c8;
  ulong local_1c0;
  undefined4 local_1a0;
  ulong local_198 [4];
  undefined4 local_178;
  ulong local_170;
  undefined4 local_150;
  undefined1 local_148 [24];
  undefined1 local_130 [8];
  size_t miblen;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_120;
  undefined1 local_108 [8];
  size_t sz_10;
  undefined1 local_f8 [32];
  ulong local_d8;
  uint64_t uptime;
  size_t sz_12;
  undefined8 local_c0;
  size_t allocated;
  size_t active;
  size_t metadata;
  size_t metadata_thp;
  size_t resident;
  size_t mapped;
  size_t retained;
  size_t num_background_threads;
  uint64_t background_thread_num_runs;
  uint64_t background_thread_run_interval;
  undefined4 local_64;
  emitter_row_t local_60;
  _Bool destroyed_initialized;
  undefined4 local_50;
  undefined4 local_4c;
  uint local_48;
  uint local_44;
  undefined8 local_40;
  size_t local_38;
  uint narenas;
  
  psVar21 = &local_368;
  psVar20 = &local_368;
  local_50 = (undefined4)CONCAT71(in_register_00000089,large);
  local_4c = (undefined4)CONCAT71(in_register_00000081,bins);
  local_44 = (uint)CONCAT71(in_register_00000009,unmerged);
  local_48 = (uint)CONCAT71(in_register_00000011,destroyed);
  local_64 = (undefined4)CONCAT71(in_register_00000031,merged);
  local_2e8 = (undefined1  [8])0x8;
  uStack_370 = 0x13e5f8;
  iVar15 = je_mallctl("stats.allocated",&local_c0,(size_t *)local_2e8,(void *)0x0,0);
  if (iVar15 == 0) {
    local_2e8 = (undefined1  [8])0x8;
    uStack_370 = 0x13e626;
    iVar15 = je_mallctl("stats.active",&allocated,(size_t *)local_2e8,(void *)0x0,0);
    if (iVar15 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar24 = "stats.active";
      psVar20 = &local_368;
      goto LAB_00140489;
    }
    local_2e8 = (undefined1  [8])0x8;
    uStack_370 = 0x13e654;
    iVar15 = je_mallctl("stats.metadata",&active,(size_t *)local_2e8,(void *)0x0,0);
    if (iVar15 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar24 = "stats.metadata";
      psVar20 = &local_368;
      goto LAB_00140489;
    }
    local_2e8 = (undefined1  [8])0x8;
    uStack_370 = 0x13e682;
    iVar15 = je_mallctl("stats.metadata_thp",&metadata,(size_t *)local_2e8,(void *)0x0,0);
    if (iVar15 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar24 = "stats.metadata_thp";
      psVar20 = &local_368;
      goto LAB_00140489;
    }
    local_2e8 = (undefined1  [8])0x8;
    uStack_370 = 0x13e6b0;
    iVar15 = je_mallctl("stats.resident",&metadata_thp,(size_t *)local_2e8,(void *)0x0,0);
    if (iVar15 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar24 = "stats.resident";
      psVar20 = &local_368;
      goto LAB_00140489;
    }
    local_2e8 = (undefined1  [8])0x8;
    uStack_370 = 0x13e6de;
    iVar15 = je_mallctl("stats.mapped",&resident,(size_t *)local_2e8,(void *)0x0,0);
    if (iVar15 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar24 = "stats.mapped";
      psVar20 = &local_368;
      goto LAB_00140489;
    }
    local_2e8 = (undefined1  [8])0x8;
    uStack_370 = 0x13e70c;
    iVar15 = je_mallctl("stats.retained",&mapped,(size_t *)local_2e8,(void *)0x0,0);
    if (iVar15 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar24 = "stats.retained";
      psVar20 = &local_368;
      goto LAB_00140489;
    }
    local_2e8 = (undefined1  [8])0x8;
    uStack_370 = 0x13e737;
    iVar15 = je_mallctl("stats.background_thread.num_threads",&retained,(size_t *)local_2e8,
                        (void *)0x0,0);
    if (iVar15 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar24 = "stats.background_thread.num_threads";
      psVar20 = &local_368;
      goto LAB_00140489;
    }
    local_2e8 = (undefined1  [8])0x8;
    uStack_370 = 0x13e762;
    iVar15 = je_mallctl("stats.background_thread.num_runs",&num_background_threads,
                        (size_t *)local_2e8,(void *)0x0,0);
    if (iVar15 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar24 = "stats.background_thread.num_runs";
      psVar20 = &local_368;
      goto LAB_00140489;
    }
    local_2e8 = (undefined1  [8])0x8;
    uStack_370 = 0x13e78d;
    iVar15 = je_mallctl("stats.background_thread.run_interval",&background_thread_num_runs,
                        (size_t *)local_2e8,(void *)0x0,0);
    if (iVar15 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar24 = "stats.background_thread.run_interval";
      psVar20 = &local_368;
      goto LAB_00140489;
    }
    local_40 = emitter;
    if (emitter->output == emitter_output_json) {
      if (emitter->emitted_key == true) {
        emitter->emitted_key = false;
      }
      else {
        pcVar24 = "";
        if (emitter->item_at_depth != false) {
          pcVar24 = ",";
        }
        uStack_370 = 0x13e7da;
        emitter_printf(emitter,"%s\n",pcVar24);
        pcVar24 = "\t";
        if (emitter->output != emitter_output_json) {
          pcVar24 = " ";
        }
        if (0 < emitter->nesting_depth) {
          iVar16 = emitter->nesting_depth << (emitter->output != emitter_output_json);
          iVar15 = 1;
          if (1 < iVar16) {
            iVar15 = iVar16;
          }
          do {
            uStack_370 = 0x13e823;
            emitter_printf(emitter,"%s",pcVar24);
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
        }
      }
      uStack_370 = 0x13e83f;
      emitter_printf(emitter,"\"%s\": ","stats");
      emitter->emitted_key = true;
      if (emitter->output == emitter_output_json) {
        emitter->emitted_key = false;
        uStack_370 = 0x13e866;
        emitter_printf(emitter,"{");
        emitter->nesting_depth = emitter->nesting_depth + 1;
        emitter->item_at_depth = false;
        if (emitter->output == emitter_output_json) {
          if (emitter->emitted_key == true) {
            emitter->emitted_key = false;
          }
          else {
            uStack_370 = 0x13e89f;
            emitter_printf(emitter,"%s\n","");
            pcVar24 = "\t";
            if (emitter->output != emitter_output_json) {
              pcVar24 = " ";
            }
            if (0 < emitter->nesting_depth) {
              iVar16 = emitter->nesting_depth << (emitter->output != emitter_output_json);
              iVar15 = 1;
              if (1 < iVar16) {
                iVar15 = iVar16;
              }
              do {
                uStack_370 = 0x13e8e8;
                emitter_printf(emitter,"%s",pcVar24);
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
            }
          }
          uStack_370 = 0x13e904;
          emitter_printf(emitter,"\"%s\": ","allocated");
          emitter->emitted_key = true;
          if (emitter->output == emitter_output_json) {
            emitter->emitted_key = false;
            uStack_370 = 0x13e93d;
            malloc_snprintf(local_2e8,10,"%%%s","zu");
            uStack_370 = 0x13e951;
            emitter_printf(emitter,local_2e8,local_c0);
            emitter->item_at_depth = true;
            if (emitter->output == emitter_output_json) {
              if (emitter->emitted_key == true) {
                emitter->emitted_key = false;
              }
              else {
                uStack_370 = 0x13e987;
                emitter_printf(emitter,"%s\n",",");
                pcVar24 = "\t";
                if (emitter->output != emitter_output_json) {
                  pcVar24 = " ";
                }
                if (0 < emitter->nesting_depth) {
                  iVar16 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                  iVar15 = 1;
                  if (1 < iVar16) {
                    iVar15 = iVar16;
                  }
                  do {
                    uStack_370 = 0x13e9d0;
                    emitter_printf(emitter,"%s",pcVar24);
                    iVar15 = iVar15 + -1;
                  } while (iVar15 != 0);
                }
              }
              uStack_370 = 0x13e9ec;
              emitter_printf(emitter,"\"%s\": ","active");
              emitter->emitted_key = true;
              if (emitter->output == emitter_output_json) {
                emitter->emitted_key = false;
                uStack_370 = 0x13ea25;
                malloc_snprintf(local_2e8,10,"%%%s","zu");
                uStack_370 = 0x13ea39;
                emitter_printf(emitter,local_2e8,allocated);
                emitter->item_at_depth = true;
                if (emitter->output == emitter_output_json) {
                  if (emitter->emitted_key == true) {
                    emitter->emitted_key = false;
                  }
                  else {
                    uStack_370 = 0x13ea6f;
                    emitter_printf(emitter,"%s\n",",");
                    pcVar24 = "\t";
                    if (emitter->output != emitter_output_json) {
                      pcVar24 = " ";
                    }
                    if (0 < emitter->nesting_depth) {
                      iVar16 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                      iVar15 = 1;
                      if (1 < iVar16) {
                        iVar15 = iVar16;
                      }
                      do {
                        uStack_370 = 0x13eab8;
                        emitter_printf(emitter,"%s",pcVar24);
                        iVar15 = iVar15 + -1;
                      } while (iVar15 != 0);
                    }
                  }
                  uStack_370 = 0x13ead4;
                  emitter_printf(emitter,"\"%s\": ","metadata");
                  emitter->emitted_key = true;
                  if (emitter->output == emitter_output_json) {
                    emitter->emitted_key = false;
                    uStack_370 = 0x13eb0d;
                    malloc_snprintf(local_2e8,10,"%%%s","zu");
                    uStack_370 = 0x13eb21;
                    emitter_printf(emitter,local_2e8,active);
                    emitter->item_at_depth = true;
                    if (emitter->output == emitter_output_json) {
                      if (emitter->emitted_key == true) {
                        emitter->emitted_key = false;
                      }
                      else {
                        uStack_370 = 0x13eb57;
                        emitter_printf(emitter,"%s\n",",");
                        pcVar24 = "\t";
                        if (emitter->output != emitter_output_json) {
                          pcVar24 = " ";
                        }
                        if (0 < emitter->nesting_depth) {
                          iVar16 = emitter->nesting_depth <<
                                   (emitter->output != emitter_output_json);
                          iVar15 = 1;
                          if (1 < iVar16) {
                            iVar15 = iVar16;
                          }
                          do {
                            uStack_370 = 0x13eba0;
                            emitter_printf(emitter,"%s",pcVar24);
                            iVar15 = iVar15 + -1;
                          } while (iVar15 != 0);
                        }
                      }
                      uStack_370 = 0x13ebbc;
                      emitter_printf(emitter,"\"%s\": ","metadata_thp");
                      emitter->emitted_key = true;
                      if (emitter->output == emitter_output_json) {
                        emitter->emitted_key = false;
                        uStack_370 = 0x13ebf5;
                        malloc_snprintf(local_2e8,10,"%%%s","zu");
                        uStack_370 = 0x13ec09;
                        emitter_printf(emitter,local_2e8,metadata);
                        peVar13 = local_40;
                        emitter->item_at_depth = true;
                        if (emitter->output == emitter_output_json) {
                          if (emitter->emitted_key == true) {
                            local_40->emitted_key = false;
                          }
                          else {
                            uStack_370 = 0x13ec47;
                            emitter_printf(local_40,"%s\n",",");
                            pcVar24 = "\t";
                            if (peVar13->output != emitter_output_json) {
                              pcVar24 = " ";
                            }
                            if (0 < peVar13->nesting_depth) {
                              iVar16 = peVar13->nesting_depth <<
                                       (peVar13->output != emitter_output_json);
                              iVar15 = 1;
                              if (1 < iVar16) {
                                iVar15 = iVar16;
                              }
                              do {
                                uStack_370 = 0x13ec90;
                                emitter_printf(peVar13,"%s",pcVar24);
                                iVar15 = iVar15 + -1;
                              } while (iVar15 != 0);
                            }
                          }
                          uStack_370 = 0x13ecac;
                          emitter_printf(peVar13,"\"%s\": ","resident");
                          peVar13->emitted_key = true;
                          emitter = peVar13;
                          if (peVar13->output == emitter_output_json) {
                            peVar13->emitted_key = false;
                            uStack_370 = 0x13ece5;
                            malloc_snprintf(local_2e8,10,"%%%s","zu");
                            uStack_370 = 0x13ecf9;
                            emitter_printf(peVar13,local_2e8,metadata_thp);
                            peVar14 = local_40;
                            peVar13->item_at_depth = true;
                            if (peVar13->output == emitter_output_json) {
                              if (peVar13->emitted_key == true) {
                                local_40->emitted_key = false;
                              }
                              else {
                                uStack_370 = 0x13ed36;
                                emitter_printf(local_40,"%s\n",",");
                                eVar17 = peVar14->output;
                                iVar15 = peVar14->nesting_depth;
                                pcVar24 = "\t";
                                if (eVar17 != emitter_output_json) {
                                  pcVar24 = " ";
                                }
                                if (0 < iVar15) {
                                  iVar15 = iVar15 << (eVar17 != emitter_output_json);
                                  iVar16 = 1;
                                  if (1 < iVar15) {
                                    iVar16 = iVar15;
                                  }
                                  do {
                                    uStack_370 = 0x13ed7d;
                                    emitter_printf(local_40,"%s",pcVar24);
                                    iVar16 = iVar16 + -1;
                                  } while (iVar16 != 0);
                                }
                              }
                              emitter = local_40;
                              uStack_370 = 0x13ed9d;
                              emitter_printf(local_40,"\"%s\": ","mapped");
                              emitter->emitted_key = true;
                              if (emitter->output == emitter_output_json) {
                                emitter->emitted_key = false;
                                uStack_370 = 0x13edd6;
                                malloc_snprintf(local_2e8,10,"%%%s","zu");
                                uStack_370 = 0x13edea;
                                emitter_printf(emitter,local_2e8,resident);
                                peVar13 = local_40;
                                emitter->item_at_depth = true;
                                if (emitter->output == emitter_output_json) {
                                  if (emitter->emitted_key == true) {
                                    local_40->emitted_key = false;
                                  }
                                  else {
                                    uStack_370 = 0x13eeec;
                                    emitter_printf(local_40,"%s\n",",");
                                    eVar17 = peVar13->output;
                                    iVar15 = peVar13->nesting_depth;
                                    pcVar24 = "\t";
                                    if (eVar17 != emitter_output_json) {
                                      pcVar24 = " ";
                                    }
                                    if (0 < iVar15) {
                                      iVar15 = iVar15 << (eVar17 != emitter_output_json);
                                      iVar16 = 1;
                                      if (1 < iVar15) {
                                        iVar16 = iVar15;
                                      }
                                      do {
                                        uStack_370 = 0x13ef33;
                                        emitter_printf(local_40,"%s",pcVar24);
                                        iVar16 = iVar16 + -1;
                                      } while (iVar16 != 0);
                                    }
                                  }
                                  emitter = local_40;
                                  uStack_370 = 0x13ef53;
                                  emitter_printf(local_40,"\"%s\": ","retained");
                                  emitter->emitted_key = true;
                                  if (emitter->output == emitter_output_json) {
                                    emitter->emitted_key = false;
                                    uStack_370 = 0x13ef88;
                                    malloc_snprintf(local_2e8,10,"%%%s","zu");
                                    uStack_370 = 0x13ef9c;
                                    emitter_printf(emitter,local_2e8,mapped);
                                    emitter->item_at_depth = true;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    emitter_table_printf
              (emitter,
               "Allocated: %zu, active: %zu, metadata: %zu (n_thp %zu), resident: %zu, mapped: %zu, retained: %zu\n"
               ,local_c0,allocated,active,metadata,metadata_thp,resident,mapped);
    if (emitter->output == emitter_output_json) {
      if (emitter->emitted_key == true) {
        emitter->emitted_key = false;
      }
      else {
        pcVar24 = "";
        if (emitter->item_at_depth != false) {
          pcVar24 = ",";
        }
        uStack_370 = 0x13f029;
        emitter_printf(emitter,"%s\n",pcVar24);
        pcVar24 = "\t";
        if (emitter->output != emitter_output_json) {
          pcVar24 = " ";
        }
        if (0 < emitter->nesting_depth) {
          iVar16 = emitter->nesting_depth << (emitter->output != emitter_output_json);
          iVar15 = 1;
          if (1 < iVar16) {
            iVar15 = iVar16;
          }
          do {
            uStack_370 = 0x13f072;
            emitter_printf(emitter,"%s",pcVar24);
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
        }
      }
      uStack_370 = 0x13f08e;
      emitter_printf(emitter,"\"%s\": ","background_thread");
      emitter->emitted_key = true;
      if (emitter->output == emitter_output_json) {
        emitter->emitted_key = false;
        uStack_370 = 0x13f0b5;
        emitter_printf(emitter,"{");
        emitter->nesting_depth = emitter->nesting_depth + 1;
        emitter->item_at_depth = false;
        if (emitter->output == emitter_output_json) {
          if (emitter->emitted_key == true) {
            emitter->emitted_key = false;
          }
          else {
            uStack_370 = 0x13f0ee;
            emitter_printf(emitter,"%s\n","");
            pcVar24 = "\t";
            if (emitter->output != emitter_output_json) {
              pcVar24 = " ";
            }
            if (0 < emitter->nesting_depth) {
              iVar16 = emitter->nesting_depth << (emitter->output != emitter_output_json);
              iVar15 = 1;
              if (1 < iVar16) {
                iVar15 = iVar16;
              }
              do {
                uStack_370 = 0x13f137;
                emitter_printf(emitter,"%s",pcVar24);
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
            }
          }
          uStack_370 = 0x13f153;
          emitter_printf(emitter,"\"%s\": ","num_threads");
          emitter->emitted_key = true;
          if (emitter->output == emitter_output_json) {
            emitter->emitted_key = false;
            uStack_370 = 0x13f18c;
            malloc_snprintf(local_2e8,10,"%%%s","zu");
            uStack_370 = 0x13f19d;
            emitter_printf(emitter,local_2e8,retained);
            emitter->item_at_depth = true;
            if (emitter->output == emitter_output_json) {
              if (emitter->emitted_key == true) {
                emitter->emitted_key = false;
              }
              else {
                uStack_370 = 0x13f1d3;
                emitter_printf(emitter,"%s\n",",");
                pcVar24 = "\t";
                if (emitter->output != emitter_output_json) {
                  pcVar24 = " ";
                }
                if (0 < emitter->nesting_depth) {
                  iVar16 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                  iVar15 = 1;
                  if (1 < iVar16) {
                    iVar15 = iVar16;
                  }
                  do {
                    uStack_370 = 0x13f21c;
                    emitter_printf(emitter,"%s",pcVar24);
                    iVar15 = iVar15 + -1;
                  } while (iVar15 != 0);
                }
              }
              uStack_370 = 0x13f238;
              emitter_printf(emitter,"\"%s\": ","num_runs");
              emitter->emitted_key = true;
              if (emitter->output == emitter_output_json) {
                emitter->emitted_key = false;
                uStack_370 = 0x13f271;
                malloc_snprintf(local_2e8,10,"%%%s","lu");
                uStack_370 = 0x13f282;
                emitter_printf(emitter,local_2e8,num_background_threads);
                emitter->item_at_depth = true;
                if (emitter->output == emitter_output_json) {
                  if (emitter->emitted_key == true) {
                    emitter->emitted_key = false;
                  }
                  else {
                    uStack_370 = 0x13f2b8;
                    emitter_printf(emitter,"%s\n",",");
                    pcVar24 = "\t";
                    if (emitter->output != emitter_output_json) {
                      pcVar24 = " ";
                    }
                    if (0 < emitter->nesting_depth) {
                      iVar16 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                      iVar15 = 1;
                      if (1 < iVar16) {
                        iVar15 = iVar16;
                      }
                      do {
                        uStack_370 = 0x13f301;
                        emitter_printf(emitter,"%s",pcVar24);
                        iVar15 = iVar15 + -1;
                      } while (iVar15 != 0);
                    }
                  }
                  uStack_370 = 0x13f31d;
                  emitter_printf(emitter,"\"%s\": ","run_interval");
                  emitter->emitted_key = true;
                  if (emitter->output == emitter_output_json) {
                    emitter->emitted_key = false;
                    uStack_370 = 0x13f356;
                    malloc_snprintf(local_2e8,10,"%%%s","lu");
                    uStack_370 = 0x13f367;
                    emitter_printf(emitter,local_2e8,background_thread_num_runs);
                    emitter->item_at_depth = true;
                    if (emitter->output == emitter_output_json) {
                      emitter->nesting_depth = emitter->nesting_depth + -1;
                      uStack_370 = 0x13f388;
                      emitter_printf(emitter,"\n");
                      pcVar24 = "\t";
                      if (emitter->output != emitter_output_json) {
                        pcVar24 = " ";
                      }
                      if (0 < emitter->nesting_depth) {
                        iVar16 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                        iVar15 = 1;
                        if (1 < iVar16) {
                          iVar15 = iVar16;
                        }
                        do {
                          uStack_370 = 0x13f3d1;
                          emitter_printf(emitter,"%s",pcVar24);
                          iVar15 = iVar15 + -1;
                        } while (iVar15 != 0);
                      }
                      uStack_370 = 0x13f3e6;
                      emitter_printf(emitter,"}");
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    uStack_370 = 0x13f403;
    emitter_table_printf
              (emitter,"Background threads: %zu, num_runs: %lu, run_interval: %lu ns\n",retained);
    if (mutex) {
      local_60.cols.qlh_first = (anon_struct_8_1_803fbc3e_for_cols)(emitter_col_t *)0x0;
      uStack_370 = 0x13f439;
      mutex_stats_init_cols
                (&local_60,"",(emitter_col_t *)local_130,(emitter_col_t *)local_2e8,
                 (emitter_col_t *)local_108);
      eVar17 = emitter->output;
      if (eVar17 == emitter_output_table) {
        eVar18.cols.qlh_first = local_60.cols.qlh_first;
        if (local_60.cols.qlh_first != (emitter_col_t *)0x0) {
          do {
            uStack_370 = 0x13f45f;
            emitter_print_value(emitter,((emitter_col_t *)eVar18.cols.qlh_first)->justify,
                                ((emitter_col_t *)eVar18.cols.qlh_first)->width,
                                ((emitter_col_t *)eVar18.cols.qlh_first)->type,
                                &((emitter_col_t *)eVar18.cols.qlh_first)->field_3);
            eVar18.cols.qlh_first =
                 (anon_struct_8_1_803fbc3e_for_cols)
                 (((emitter_col_t *)eVar18.cols.qlh_first)->link).qre_next;
            if (eVar18.cols.qlh_first == (emitter_col_t *)0x0) break;
          } while (eVar18.cols.qlh_first != local_60.cols.qlh_first);
        }
        uStack_370 = 0x13f47f;
        emitter_table_printf(emitter,"\n");
        eVar17 = emitter->output;
      }
      if (eVar17 == emitter_output_json) {
        if (emitter->emitted_key == true) {
          emitter->emitted_key = false;
        }
        else {
          pcVar24 = ",";
          if (emitter->item_at_depth == false) {
            pcVar24 = "";
          }
          uStack_370 = 0x13f4c1;
          emitter_printf(emitter,"%s\n",pcVar24);
          pcVar24 = "\t";
          if (emitter->output != emitter_output_json) {
            pcVar24 = " ";
          }
          if (0 < emitter->nesting_depth) {
            iVar16 = emitter->nesting_depth << (emitter->output != emitter_output_json);
            iVar15 = 1;
            if (1 < iVar16) {
              iVar15 = iVar16;
            }
            do {
              uStack_370 = 0x13f50a;
              emitter_printf(emitter,"%s",pcVar24);
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
          }
        }
        uStack_370 = 0x13f526;
        emitter_printf(emitter,"\"%s\": ","mutexes");
        emitter->emitted_key = true;
        if (emitter->output == emitter_output_json) {
          emitter->emitted_key = false;
          uStack_370 = 0x13f549;
          emitter_printf(emitter,"{");
          emitter->nesting_depth = emitter->nesting_depth + 1;
          emitter->item_at_depth = false;
        }
      }
      local_38 = 7;
      uptime = 8;
      uStack_370 = 0x13f57a;
      iVar15 = je_mallctlnametomib("stats.arenas.0.uptime",&local_368,&local_38);
      if (iVar15 != 0) {
        format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
        pcVar24 = "stats.arenas.0.uptime";
        psVar20 = &local_368;
        goto LAB_00140489;
      }
      arena_ind_str[8] = '\0';
      arena_ind_str[9] = '\0';
      arena_ind_str[10] = '\0';
      arena_ind_str[0xb] = '\0';
      arena_ind_str[0xc] = '\0';
      arena_ind_str[0xd] = '\0';
      arena_ind_str[0xe] = '\0';
      arena_ind_str[0xf] = '\0';
      uStack_370 = 0x13f5ae;
      iVar15 = je_mallctlbymib(&local_368,local_38,&local_d8,&uptime,(void *)0x0,0);
      if (iVar15 != 0) goto LAB_00140495;
      puVar22 = (undefined1 *)0x0;
      do {
        uVar19 = local_d8;
        aVar1 = (anon_union_8_10_2a69db89_for_emitter_col_s_3)
                ((anon_union_8_10_2a69db89_for_emitter_col_s_3 *)
                (global_mutex_names + (long)puVar22))->uint64_val;
        sz = CONCAT44(sz._4_4_,4);
        uStack_370 = 0x13f613;
        local_120 = aVar1;
        _destroyed_initialized = puVar22;
        malloc_snprintf((char *)&local_368,0x80,"stats.%s.%s.%s","mutexes",aVar1.uint64_val,
                        "num_ops");
        local_38 = 8;
        uStack_370 = 0x13f636;
        iVar15 = je_mallctl((char *)&local_368,local_2d8,&local_38,(void *)0x0,0);
        if (iVar15 != 0) {
LAB_0014047b:
          format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
          pcVar24 = (char *)&local_368;
          psVar20 = &local_368;
          goto LAB_00140489;
        }
        local_2b8 = 4;
        if (local_2d8[0].uint64_val == 0 || uVar19 == 0) {
          local_2b0.uint64_val = 0;
        }
        else {
          local_2b0 = local_2d8[0];
          if (999999999 < uVar19) {
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_2d8[0].uint64_val;
            local_2b0.uint64_val =
                 SUB168(auVar2 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                                 (undefined1  [16])0x1fffffffffffff),0);
          }
        }
        local_290 = 4;
        uStack_370 = 0x13f6cf;
        malloc_snprintf((char *)&local_368,0x80,"stats.%s.%s.%s","mutexes",aVar1.uint64_val,
                        "num_wait");
        local_38 = 8;
        uStack_370 = 0x13f6ef;
        iVar15 = je_mallctl((char *)&local_368,local_288,&local_38,(void *)0x0,0);
        if (iVar15 != 0) goto LAB_0014047b;
        local_268 = 4;
        if (local_288[0] == 0 || uVar19 == 0) {
          local_260 = 0;
        }
        else {
          local_260 = local_288[0];
          if (999999999 < uVar19) {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_288[0];
            local_260 = SUB168(auVar3 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                                        (undefined1  [16])0x1fffffffffffff),0);
          }
        }
        local_240 = 4;
        uStack_370 = 0x13f77b;
        malloc_snprintf((char *)&local_368,0x80,"stats.%s.%s.%s","mutexes",aVar1.uint64_val,
                        "num_spin_acq");
        local_38 = 8;
        uStack_370 = 0x13f79b;
        iVar15 = je_mallctl((char *)&local_368,local_238,&local_38,(void *)0x0,0);
        if (iVar15 != 0) goto LAB_0014047b;
        local_218 = 4;
        if (local_238[0] == 0 || uVar19 == 0) {
          local_210 = 0;
        }
        else {
          local_210 = local_238[0];
          if (999999999 < uVar19) {
            auVar4._8_8_ = 0;
            auVar4._0_8_ = local_238[0];
            local_210 = SUB168(auVar4 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                                        (undefined1  [16])0x1fffffffffffff),0);
          }
        }
        local_1f0 = 4;
        uStack_370 = 0x13f827;
        malloc_snprintf((char *)&local_368,0x80,"stats.%s.%s.%s","mutexes",aVar1.uint64_val,
                        "num_owner_switch");
        local_38 = 8;
        uStack_370 = 0x13f847;
        iVar15 = je_mallctl((char *)&local_368,local_1e8,&local_38,(void *)0x0,0);
        if (iVar15 != 0) goto LAB_0014047b;
        local_1c8 = 4;
        if (local_1e8[0] == 0 || uVar19 == 0) {
          local_1c0 = 0;
        }
        else {
          local_1c0 = local_1e8[0];
          if (999999999 < uVar19) {
            auVar5._8_8_ = 0;
            auVar5._0_8_ = local_1e8[0];
            local_1c0 = SUB168(auVar5 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                                        (undefined1  [16])0x1fffffffffffff),0);
          }
        }
        local_1a0 = 4;
        uStack_370 = 0x13f8d3;
        malloc_snprintf((char *)&local_368,0x80,"stats.%s.%s.%s","mutexes",aVar1.uint64_val,
                        "total_wait_time");
        local_38 = 8;
        uStack_370 = 0x13f8f3;
        iVar15 = je_mallctl((char *)&local_368,local_198,&local_38,(void *)0x0,0);
        if (iVar15 != 0) goto LAB_0014047b;
        local_178 = 4;
        if (local_198[0] == 0 || uVar19 == 0) {
          local_170 = 0;
        }
        else {
          local_170 = local_198[0];
          if (999999999 < uVar19) {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_198[0];
            local_170 = SUB168(auVar6 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                                        (undefined1  [16])0x1fffffffffffff),0);
          }
        }
        local_150 = 4;
        uStack_370 = 0x13f97f;
        malloc_snprintf((char *)&local_368,0x80,"stats.%s.%s.%s","mutexes",aVar1.uint64_val,
                        "max_wait_time");
        local_38 = 8;
        uStack_370 = 0x13f9a5;
        iVar15 = je_mallctl((char *)&local_368,local_148,&local_38,(void *)0x0,0);
        if (iVar15 != 0) goto LAB_0014047b;
        sz_10._0_4_ = 3;
        uStack_370 = 0x13f9d6;
        malloc_snprintf((char *)&local_368,0x80,"stats.%s.%s.%s");
        local_38 = 4;
        uStack_370 = 0x13f9f5;
        iVar15 = je_mallctl((char *)&local_368,local_f8,&local_38,(void *)0x0,0);
        peVar13 = local_40;
        if (iVar15 != 0) goto LAB_0014047b;
        if (local_40->output == emitter_output_json) {
          background_thread_run_interval =
               (uint64_t)global_mutex_names[(long)_destroyed_initialized];
          if (local_40->emitted_key == true) {
            local_40->emitted_key = false;
          }
          else {
            pcVar24 = "";
            if (local_40->item_at_depth != false) {
              pcVar24 = ",";
            }
            uStack_370 = 0x13fa58;
            emitter_printf(local_40,"%s\n",pcVar24);
            pcVar24 = "\t";
            if (peVar13->output != emitter_output_json) {
              pcVar24 = " ";
            }
            if (0 < peVar13->nesting_depth) {
              iVar15 = peVar13->nesting_depth << (peVar13->output != emitter_output_json);
              if (iVar15 < 2) {
                iVar15 = 1;
              }
              do {
                uStack_370 = 0x13faa6;
                emitter_printf(peVar13,"%s",pcVar24);
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
            }
          }
          uStack_370 = 0x13fac0;
          emitter_printf(peVar13,"\"%s\": ",background_thread_run_interval);
          peVar13->emitted_key = true;
          if (peVar13->output == emitter_output_json) {
            peVar13->emitted_key = false;
            uStack_370 = 0x13fae6;
            emitter_printf(peVar13,"{");
            peVar13->nesting_depth = peVar13->nesting_depth + 1;
            peVar13->item_at_depth = false;
          }
        }
        uStack_370 = 0x13fb0a;
        mutex_stats_emit(peVar13,&local_60,(emitter_col_t *)local_2e8,(emitter_col_t *)local_108);
        peVar14 = local_40;
        if (peVar13->output == emitter_output_json) {
          local_40->nesting_depth = local_40->nesting_depth + -1;
          local_40->item_at_depth = true;
          uStack_370 = 0x13fb35;
          emitter_printf(local_40,"\n");
          pcVar24 = "\t";
          if (peVar14->output != emitter_output_json) {
            pcVar24 = " ";
          }
          if (0 < peVar14->nesting_depth) {
            iVar15 = peVar14->nesting_depth << (peVar14->output != emitter_output_json);
            if (iVar15 < 2) {
              iVar15 = 1;
            }
            do {
              uStack_370 = 0x13fb83;
              emitter_printf(peVar14,"%s",pcVar24);
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
          }
          uStack_370 = 0x13fb99;
          emitter_printf(peVar14,"}");
        }
        emitter = local_40;
        puVar22 = _destroyed_initialized + 1;
      } while (puVar22 != (undefined1 *)0x3);
      if (local_40->output == emitter_output_json) {
        local_40->nesting_depth = local_40->nesting_depth + -1;
        local_40->item_at_depth = true;
        uStack_370 = 0x13fbdd;
        emitter_printf(local_40,"\n");
        pcVar24 = "\t";
        if (emitter->output != emitter_output_json) {
          pcVar24 = " ";
        }
        if (0 < emitter->nesting_depth) {
          iVar16 = emitter->nesting_depth << (emitter->output != emitter_output_json);
          iVar15 = 1;
          if (1 < iVar16) {
            iVar15 = iVar16;
          }
          do {
            uStack_370 = 0x13fc26;
            emitter_printf(emitter,"%s",pcVar24);
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
        }
        uStack_370 = 0x13fc3b;
        emitter_printf(emitter,"}");
      }
    }
    if (emitter->output == emitter_output_json) {
      emitter->nesting_depth = emitter->nesting_depth + -1;
      emitter->item_at_depth = true;
      uStack_370 = 0x13fc5c;
      emitter_printf(emitter,"\n");
      pcVar24 = "\t";
      if (emitter->output != emitter_output_json) {
        pcVar24 = " ";
      }
      if (0 < emitter->nesting_depth) {
        iVar16 = emitter->nesting_depth << (emitter->output != emitter_output_json);
        iVar15 = 1;
        if (1 < iVar16) {
          iVar15 = iVar16;
        }
        do {
          uStack_370 = 0x13fca5;
          emitter_printf(emitter,"%s",pcVar24);
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      uStack_370 = 0x13fcba;
      emitter_printf(emitter,"}");
    }
    if ((byte)((byte)local_64 | (byte)local_48 | (byte)local_44) != 1) {
      return;
    }
    if (emitter->output == emitter_output_json) {
      if (emitter->emitted_key == true) {
        emitter->emitted_key = false;
      }
      else {
        pcVar24 = "";
        if (emitter->item_at_depth != false) {
          pcVar24 = ",";
        }
        uStack_370 = 0x13fd0c;
        emitter_printf(emitter,"%s\n",pcVar24);
        pcVar24 = "\t";
        if (emitter->output != emitter_output_json) {
          pcVar24 = " ";
        }
        if (0 < emitter->nesting_depth) {
          iVar16 = emitter->nesting_depth << (emitter->output != emitter_output_json);
          iVar15 = 1;
          if (1 < iVar16) {
            iVar15 = iVar16;
          }
          do {
            uStack_370 = 0x13fd55;
            emitter_printf(emitter,"%s",pcVar24);
            iVar15 = iVar15 + -1;
          } while (iVar15 != 0);
        }
      }
      uStack_370 = 0x13fd71;
      emitter_printf(emitter,"\"%s\": ","stats.arenas");
      emitter->emitted_key = true;
      if (emitter->output == emitter_output_json) {
        emitter->emitted_key = false;
        uStack_370 = 0x13fd94;
        emitter_printf(emitter,"{");
        emitter->nesting_depth = emitter->nesting_depth + 1;
        emitter->item_at_depth = false;
      }
    }
    local_2e8 = (undefined1  [8])0x4;
    uStack_370 = 0x13fdbf;
    iVar15 = je_mallctl("arenas.narenas",&local_38,(size_t *)local_2e8,(void *)0x0,0);
    if (iVar15 == 0) {
      local_130 = (undefined1  [8])0x3;
      lVar7 = -((local_38 & 0xffffffff) + 0xf & 0xfffffffffffffff0);
      psVar21 = (size_t *)((long)&local_368 + lVar7);
      _destroyed_initialized = (undefined1 *)psVar21;
      *(undefined8 *)((long)&uStack_370 + lVar7) = 0x13fe03;
      iVar15 = je_mallctlnametomib("arena.0.initialized",(size_t *)local_2e8,(size_t *)local_130);
      if (iVar15 == 0) {
        if ((uint)local_38 == 0) {
          bVar25 = true;
          sz_12 = (size_t)&local_368;
        }
        else {
          uVar19 = 0;
          uVar23 = 0;
          sz_12 = (size_t)&local_368;
          do {
            auVar8 = local_130;
            local_108 = (undefined1  [8])0x1;
            oldp = _destroyed_initialized + uVar19;
            sz = uVar19;
            *(undefined8 *)((long)&uStack_370 + lVar7) = 0x13fe60;
            iVar15 = je_mallctlbymib((size_t *)local_2e8,(size_t)auVar8,oldp,(size_t *)local_108,
                                     (void *)0x0,0);
            if (iVar15 != 0) goto LAB_00140495;
            uVar23 = uVar23 + *oldp;
            uVar19 = uVar19 + 1;
          } while (uVar19 < (local_38 & 0xffffffff));
          bVar25 = uVar23 < 2;
          emitter = local_40;
        }
        auVar8 = local_130;
        sz = 0x1001;
        local_108 = (undefined1  [8])0x1;
        *(undefined8 *)((long)&uStack_370 + lVar7) = 0x13febd;
        iVar15 = je_mallctlbymib((size_t *)local_2e8,(size_t)auVar8,&local_60,(size_t *)local_108,
                                 (void *)0x0,0);
        if (iVar15 == 0) {
          if (((char)local_64 != '\0') && ((bVar25 & (byte)local_44) == 0)) {
            *(undefined8 *)((long)&uStack_370 + lVar7) = 0x13feed;
            emitter_table_printf(emitter,"Merged arenas stats:\n");
            if (emitter->output == emitter_output_json) {
              if (emitter->emitted_key == true) {
                emitter->emitted_key = false;
              }
              else {
                pcVar24 = "";
                if (emitter->item_at_depth != false) {
                  pcVar24 = ",";
                }
                *(undefined8 *)((long)&uStack_370 + lVar7) = 0x13ff2e;
                emitter_printf(emitter,"%s\n",pcVar24);
                pcVar24 = "\t";
                if (emitter->output != emitter_output_json) {
                  pcVar24 = " ";
                }
                if (0 < emitter->nesting_depth) {
                  iVar16 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                  iVar15 = 1;
                  if (1 < iVar16) {
                    iVar15 = iVar16;
                  }
                  do {
                    *(undefined8 *)((long)&uStack_370 + lVar7) = 0x13ff77;
                    emitter_printf(emitter,"%s",pcVar24);
                    iVar15 = iVar15 + -1;
                  } while (iVar15 != 0);
                }
              }
              *(undefined8 *)((long)&uStack_370 + lVar7) = 0x13ff93;
              emitter_printf(emitter,"\"%s\": ","merged");
              emitter->emitted_key = true;
              if (emitter->output == emitter_output_json) {
                emitter->emitted_key = false;
                *(undefined8 *)((long)&uStack_370 + lVar7) = 0x13ffb6;
                emitter_printf(emitter,"{");
                emitter->nesting_depth = emitter->nesting_depth + 1;
                emitter->item_at_depth = false;
              }
            }
            _Var11 = local_4c._0_1_;
            _Var10 = local_50._0_1_;
            *(undefined8 *)((long)&uStack_370 + lVar7) = 0x13ffdc;
            stats_arena_print(emitter,0x1000,_Var11,_Var10,mutex,extents);
            if (emitter->output == emitter_output_json) {
              emitter->nesting_depth = emitter->nesting_depth + -1;
              emitter->item_at_depth = true;
              *(undefined8 *)((long)&uStack_370 + lVar7) = 0x13fffd;
              emitter_printf(emitter,"\n");
              pcVar24 = "\t";
              if (emitter->output != emitter_output_json) {
                pcVar24 = " ";
              }
              if (0 < emitter->nesting_depth) {
                iVar16 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                iVar15 = 1;
                if (1 < iVar16) {
                  iVar15 = iVar16;
                }
                do {
                  *(undefined8 *)((long)&uStack_370 + lVar7) = 0x140046;
                  emitter_printf(emitter,"%s",pcVar24);
                  iVar15 = iVar15 + -1;
                } while (iVar15 != 0);
              }
              *(undefined8 *)((long)&uStack_370 + lVar7) = 0x14005b;
              emitter_printf(emitter,"}");
            }
          }
          if (((byte)local_48 & (byte)local_60.cols.qlh_first) == 1) {
            *(undefined8 *)((long)&uStack_370 + lVar7) = 0x14007a;
            emitter_table_printf(emitter,"Destroyed arenas stats:\n");
            if (emitter->output == emitter_output_json) {
              if (emitter->emitted_key == true) {
                emitter->emitted_key = false;
              }
              else {
                pcVar24 = "";
                if (emitter->item_at_depth != false) {
                  pcVar24 = ",";
                }
                *(undefined8 *)((long)&uStack_370 + lVar7) = 0x1400bb;
                emitter_printf(emitter,"%s\n",pcVar24);
                pcVar24 = "\t";
                if (emitter->output != emitter_output_json) {
                  pcVar24 = " ";
                }
                if (0 < emitter->nesting_depth) {
                  iVar16 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                  iVar15 = 1;
                  if (1 < iVar16) {
                    iVar15 = iVar16;
                  }
                  do {
                    *(undefined8 *)((long)&uStack_370 + lVar7) = 0x140104;
                    emitter_printf(emitter,"%s",pcVar24);
                    iVar15 = iVar15 + -1;
                  } while (iVar15 != 0);
                }
              }
              *(undefined8 *)((long)&uStack_370 + lVar7) = 0x140120;
              emitter_printf(emitter,"\"%s\": ","destroyed");
              emitter->emitted_key = true;
              if (emitter->output == emitter_output_json) {
                emitter->emitted_key = false;
                *(undefined8 *)((long)&uStack_370 + lVar7) = 0x140143;
                emitter_printf(emitter,"{");
                emitter->nesting_depth = emitter->nesting_depth + 1;
                emitter->item_at_depth = false;
              }
            }
            _Var11 = local_4c._0_1_;
            _Var10 = local_50._0_1_;
            *(undefined8 *)((long)&uStack_370 + lVar7) = 0x140169;
            stats_arena_print(emitter,0x1001,_Var11,_Var10,mutex,extents);
            if (emitter->output == emitter_output_json) {
              emitter->nesting_depth = emitter->nesting_depth + -1;
              emitter->item_at_depth = true;
              *(undefined8 *)((long)&uStack_370 + lVar7) = 0x14018a;
              emitter_printf(emitter,"\n");
              pcVar24 = "\t";
              if (emitter->output != emitter_output_json) {
                pcVar24 = " ";
              }
              if (0 < emitter->nesting_depth) {
                iVar16 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                iVar15 = 1;
                if (1 < iVar16) {
                  iVar15 = iVar16;
                }
                do {
                  *(undefined8 *)((long)&uStack_370 + lVar7) = 0x1401d3;
                  emitter_printf(emitter,"%s",pcVar24);
                  iVar15 = iVar15 + -1;
                } while (iVar15 != 0);
              }
              *(undefined8 *)((long)&uStack_370 + lVar7) = 0x1401e8;
              emitter_printf(emitter,"}");
            }
          }
          if (((byte)local_44 & (uint)local_38 != 0) == 1) {
            local_40 = (emitter_t *)(CONCAT44(local_40._4_4_,local_4c) & 0xffffffff000000ff);
            background_thread_run_interval =
                 CONCAT44(background_thread_run_interval._4_4_,local_50) & 0xffffffff000000ff;
            local_44 = (uint)mutex;
            local_48 = (uint)extents;
            uVar19 = 0;
            uVar23 = (uint)local_38;
            do {
              if (_destroyed_initialized[uVar19] == '\x01') {
                *(undefined8 *)((long)&uStack_370 + lVar7) = 0x140253;
                malloc_snprintf((char *)&local_368,0x14,"%u",uVar19 & 0xffffffff);
                if (emitter->output == emitter_output_json) {
                  if (emitter->emitted_key == true) {
                    emitter->emitted_key = false;
                  }
                  else {
                    pcVar24 = "";
                    if (emitter->item_at_depth != false) {
                      pcVar24 = ",";
                    }
                    *(undefined8 *)((long)&uStack_370 + lVar7) = 0x140294;
                    emitter_printf(emitter,"%s\n",pcVar24);
                    pcVar24 = "\t";
                    if (emitter->output != emitter_output_json) {
                      pcVar24 = " ";
                    }
                    if (0 < emitter->nesting_depth) {
                      iVar15 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                      if (iVar15 < 2) {
                        iVar15 = 1;
                      }
                      do {
                        *(undefined8 *)((long)&uStack_370 + lVar7) = 0x1402d6;
                        emitter_printf(emitter,"%s",pcVar24);
                        iVar15 = iVar15 + -1;
                      } while (iVar15 != 0);
                    }
                  }
                  *(undefined8 *)((long)&uStack_370 + lVar7) = 0x1402f5;
                  emitter_printf(emitter,"\"%s\": ",&local_368);
                  emitter->emitted_key = true;
                  if (emitter->output == emitter_output_json) {
                    emitter->emitted_key = false;
                    *(undefined8 *)((long)&uStack_370 + lVar7) = 0x140318;
                    emitter_printf(emitter,"{");
                    emitter->nesting_depth = emitter->nesting_depth + 1;
                    emitter->item_at_depth = false;
                  }
                }
                *(undefined8 *)((long)&uStack_370 + lVar7) = 0x140334;
                emitter_table_printf(emitter,"arenas[%s]:\n",&local_368);
                peVar13 = local_40;
                uVar12 = local_44;
                uVar23 = local_48;
                uVar9 = background_thread_run_interval;
                *(undefined8 *)((long)&uStack_370 + lVar7) = 0x14034d;
                stats_arena_print(emitter,(uint)uVar19,SUB81(peVar13,0),SUB81(uVar9,0),
                                  SUB41(uVar12,0),SUB41(uVar23,0));
                if (emitter->output == emitter_output_json) {
                  emitter->nesting_depth = emitter->nesting_depth + -1;
                  emitter->item_at_depth = true;
                  *(undefined8 *)((long)&uStack_370 + lVar7) = 0x14036e;
                  emitter_printf(emitter,"\n");
                  pcVar24 = "\t";
                  if (emitter->output != emitter_output_json) {
                    pcVar24 = " ";
                  }
                  if (0 < emitter->nesting_depth) {
                    iVar15 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                    if (iVar15 < 2) {
                      iVar15 = 1;
                    }
                    do {
                      *(undefined8 *)((long)&uStack_370 + lVar7) = 0x1403b3;
                      emitter_printf(emitter,"%s",pcVar24);
                      iVar15 = iVar15 + -1;
                    } while (iVar15 != 0);
                  }
                  *(undefined8 *)((long)&uStack_370 + lVar7) = 0x1403c8;
                  emitter_printf(emitter,"}");
                }
                uVar23 = (uint)local_38;
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 < uVar23);
          }
          if (emitter->output != emitter_output_json) {
            return;
          }
          emitter->nesting_depth = emitter->nesting_depth + -1;
          emitter->item_at_depth = true;
          *(undefined8 *)((long)&uStack_370 + lVar7) = 0x14040b;
          emitter_printf(emitter,"\n");
          pcVar24 = "\t";
          if (emitter->output != emitter_output_json) {
            pcVar24 = " ";
          }
          if (0 < emitter->nesting_depth) {
            iVar16 = emitter->nesting_depth << (emitter->output != emitter_output_json);
            iVar15 = 1;
            if (1 < iVar16) {
              iVar15 = iVar16;
            }
            do {
              *(undefined8 *)((long)&uStack_370 + lVar7) = 0x140454;
              emitter_printf(emitter,"%s",pcVar24);
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
          }
          *(undefined8 *)((long)&uStack_370 + lVar7) = 0x140469;
          emitter_printf(emitter,"}");
          return;
        }
LAB_00140495:
        *(undefined8 *)((long)psVar21 + -8) = 0x1404a1;
        malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
        *(undefined8 *)((long)psVar21 + -8) = 0x1404a6;
        abort();
      }
      format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
      pcVar24 = "arena.0.initialized";
      psVar20 = psVar21;
    }
    else {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar24 = "arenas.narenas";
      psVar20 = &local_368;
    }
  }
  else {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar24 = "stats.allocated";
  }
LAB_00140489:
  *(undefined8 *)((long)psVar20 + -8) = 0x140490;
  malloc_printf(format,pcVar24);
  *(undefined8 *)((long)psVar20 + -8) = 0x140495;
  abort();
}

Assistant:

static void
stats_print_helper(emitter_t *emitter, bool merged, bool destroyed,
    bool unmerged, bool bins, bool large, bool mutex, bool extents) {
	/*
	 * These should be deleted.  We keep them around for a while, to aid in
	 * the transition to the emitter code.
	 */
	size_t allocated, active, metadata, metadata_thp, resident, mapped,
	    retained;
	size_t num_background_threads;
	uint64_t background_thread_num_runs, background_thread_run_interval;

	CTL_GET("stats.allocated", &allocated, size_t);
	CTL_GET("stats.active", &active, size_t);
	CTL_GET("stats.metadata", &metadata, size_t);
	CTL_GET("stats.metadata_thp", &metadata_thp, size_t);
	CTL_GET("stats.resident", &resident, size_t);
	CTL_GET("stats.mapped", &mapped, size_t);
	CTL_GET("stats.retained", &retained, size_t);

	if (have_background_thread) {
		CTL_GET("stats.background_thread.num_threads",
		    &num_background_threads, size_t);
		CTL_GET("stats.background_thread.num_runs",
		    &background_thread_num_runs, uint64_t);
		CTL_GET("stats.background_thread.run_interval",
		    &background_thread_run_interval, uint64_t);
	} else {
		num_background_threads = 0;
		background_thread_num_runs = 0;
		background_thread_run_interval = 0;
	}

	/* Generic global stats. */
	emitter_json_object_kv_begin(emitter, "stats");
	emitter_json_kv(emitter, "allocated", emitter_type_size, &allocated);
	emitter_json_kv(emitter, "active", emitter_type_size, &active);
	emitter_json_kv(emitter, "metadata", emitter_type_size, &metadata);
	emitter_json_kv(emitter, "metadata_thp", emitter_type_size,
	    &metadata_thp);
	emitter_json_kv(emitter, "resident", emitter_type_size, &resident);
	emitter_json_kv(emitter, "mapped", emitter_type_size, &mapped);
	emitter_json_kv(emitter, "retained", emitter_type_size, &retained);

	emitter_table_printf(emitter, "Allocated: %zu, active: %zu, "
	    "metadata: %zu (n_thp %zu), resident: %zu, mapped: %zu, "
	    "retained: %zu\n", allocated, active, metadata, metadata_thp,
	    resident, mapped, retained);

	/* Background thread stats. */
	emitter_json_object_kv_begin(emitter, "background_thread");
	emitter_json_kv(emitter, "num_threads", emitter_type_size,
	    &num_background_threads);
	emitter_json_kv(emitter, "num_runs", emitter_type_uint64,
	    &background_thread_num_runs);
	emitter_json_kv(emitter, "run_interval", emitter_type_uint64,
	    &background_thread_run_interval);
	emitter_json_object_end(emitter); /* Close "background_thread". */

	emitter_table_printf(emitter, "Background threads: %zu, "
	    "num_runs: %"FMTu64", run_interval: %"FMTu64" ns\n",
	    num_background_threads, background_thread_num_runs,
	    background_thread_run_interval);

	if (mutex) {
		emitter_row_t row;
		emitter_col_t name;
		emitter_col_t col64[mutex_prof_num_uint64_t_counters];
		emitter_col_t col32[mutex_prof_num_uint32_t_counters];
		uint64_t uptime;

		emitter_row_init(&row);
		mutex_stats_init_cols(&row, "", &name, col64, col32);

		emitter_table_row(emitter, &row);
		emitter_json_object_kv_begin(emitter, "mutexes");

		CTL_M2_GET("stats.arenas.0.uptime", 0, &uptime, uint64_t);

		for (int i = 0; i < mutex_prof_num_global_mutexes; i++) {
			mutex_stats_read_global(global_mutex_names[i], &name,
			    col64, col32, uptime);
			emitter_json_object_kv_begin(emitter, global_mutex_names[i]);
			mutex_stats_emit(emitter, &row, col64, col32);
			emitter_json_object_end(emitter);
		}

		emitter_json_object_end(emitter); /* Close "mutexes". */
	}

	emitter_json_object_end(emitter); /* Close "stats". */

	if (merged || destroyed || unmerged) {
		unsigned narenas;

		emitter_json_object_kv_begin(emitter, "stats.arenas");

		CTL_GET("arenas.narenas", &narenas, unsigned);
		size_t mib[3];
		size_t miblen = sizeof(mib) / sizeof(size_t);
		size_t sz;
		VARIABLE_ARRAY(bool, initialized, narenas);
		bool destroyed_initialized;
		unsigned i, j, ninitialized;

		xmallctlnametomib("arena.0.initialized", mib, &miblen);
		for (i = ninitialized = 0; i < narenas; i++) {
			mib[1] = i;
			sz = sizeof(bool);
			xmallctlbymib(mib, miblen, &initialized[i], &sz,
			    NULL, 0);
			if (initialized[i]) {
				ninitialized++;
			}
		}
		mib[1] = MALLCTL_ARENAS_DESTROYED;
		sz = sizeof(bool);
		xmallctlbymib(mib, miblen, &destroyed_initialized, &sz,
		    NULL, 0);

		/* Merged stats. */
		if (merged && (ninitialized > 1 || !unmerged)) {
			/* Print merged arena stats. */
			emitter_table_printf(emitter, "Merged arenas stats:\n");
			emitter_json_object_kv_begin(emitter, "merged");
			stats_arena_print(emitter, MALLCTL_ARENAS_ALL, bins,
			    large, mutex, extents);
			emitter_json_object_end(emitter); /* Close "merged". */
		}

		/* Destroyed stats. */
		if (destroyed_initialized && destroyed) {
			/* Print destroyed arena stats. */
			emitter_table_printf(emitter,
			    "Destroyed arenas stats:\n");
			emitter_json_object_kv_begin(emitter, "destroyed");
			stats_arena_print(emitter, MALLCTL_ARENAS_DESTROYED,
			    bins, large, mutex, extents);
			emitter_json_object_end(emitter); /* Close "destroyed". */
		}

		/* Unmerged stats. */
		if (unmerged) {
			for (i = j = 0; i < narenas; i++) {
				if (initialized[i]) {
					char arena_ind_str[20];
					malloc_snprintf(arena_ind_str,
					    sizeof(arena_ind_str), "%u", i);
					emitter_json_object_kv_begin(emitter,
					    arena_ind_str);
					emitter_table_printf(emitter,
					    "arenas[%s]:\n", arena_ind_str);
					stats_arena_print(emitter, i, bins,
					    large, mutex, extents);
					/* Close "<arena-ind>". */
					emitter_json_object_end(emitter);
				}
			}
		}
		emitter_json_object_end(emitter); /* Close "stats.arenas". */
	}
}